

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCInst.c
# Opt level: O0

void MCInst_Init(MCInst *inst)

{
  uint i;
  MCInst *inst_local;
  
  for (i = 0; i < 0x30; i = i + 1) {
    inst->Operands[i].Kind = '\0';
  }
  inst->Opcode = 0;
  inst->OpcodePub = 0;
  inst->size = '\0';
  inst->has_imm = false;
  inst->op1_size = '\0';
  inst->writeback = false;
  inst->ac_idx = '\0';
  inst->popcode_adjust = '\0';
  inst->assembly[0] = '\0';
  return;
}

Assistant:

void MCInst_Init(MCInst *inst)
{
	unsigned int i;

	for (i = 0; i < 48; i++) {
		inst->Operands[i].Kind = kInvalid;
	}

	inst->Opcode = 0;
	inst->OpcodePub = 0;
	inst->size = 0;
	inst->has_imm = false;
	inst->op1_size = 0;
	inst->writeback = false;
	inst->ac_idx = 0;
	inst->popcode_adjust = 0;
	inst->assembly[0] = '\0';
}